

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memtable.cc
# Opt level: O2

void __thiscall leveldb::MemTable::MemTable(MemTable *this,InternalKeyComparator *cmp)

{
  KeyComparator local_28;
  
  (this->comparator_).comparator.super_Comparator._vptr_Comparator =
       (_func_int **)&PTR__Comparator_00131190;
  (this->comparator_).comparator.user_comparator_ = cmp->user_comparator_;
  this->refs_ = 0;
  Arena::Arena(&this->arena_);
  local_28.comparator.super_Comparator._vptr_Comparator = (_func_int **)&PTR__Comparator_00131190;
  local_28.comparator.user_comparator_ = (this->comparator_).comparator.user_comparator_;
  SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::SkipList
            (&this->table_,&local_28,&this->arena_);
  Comparator::~Comparator((Comparator *)&local_28);
  return;
}

Assistant:

MemTable::MemTable(const InternalKeyComparator &cmp)
            : comparator_(cmp),
              refs_(0),
              table_(comparator_, &arena_) {
    }